

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__wait_children(uv_loop_t *loop)

{
  uv__queue **ppuVar1;
  uint uVar2;
  uv__queue *puVar3;
  uv__queue *puVar4;
  __pid_t _Var5;
  int *piVar6;
  uint uVar7;
  uv__queue *puVar8;
  int status;
  uv__queue pending;
  int local_3c;
  uv__queue local_38;
  
  puVar8 = (loop->process_handles).next;
  if (puVar8 != &loop->process_handles) {
    local_38.next = &local_38;
    local_38.prev = &local_38;
    do {
      puVar3 = puVar8->next;
      do {
        _Var5 = waitpid(*(__pid_t *)&puVar8[-1].prev,&local_3c,1);
        if (_Var5 != -1) {
          if (_Var5 != 0) {
            if (_Var5 != *(int *)&puVar8[-1].prev) {
              __assert_fail("pid == process->pid",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                            ,0xa0,"void uv__wait_children(uv_loop_t *)");
            }
            *(undefined4 *)&puVar8[-1].prev = 0;
            *(int *)&puVar8[1].next = local_3c;
            puVar4 = puVar8->next;
            puVar8->prev->next = puVar4;
            puVar4->prev = puVar8->prev;
            puVar8->next = &local_38;
            puVar8->prev = local_38.prev;
            (local_38.prev)->next = puVar8;
            local_38.prev = puVar8;
          }
          goto LAB_0011e078;
        }
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      if (*piVar6 != 10) {
        abort();
      }
LAB_0011e078:
      puVar8 = puVar3;
    } while (puVar3 != &loop->process_handles);
    puVar8 = local_38.next;
    if (local_38.next != &local_38) {
      do {
        puVar3 = puVar8->next;
        puVar8->prev->next = puVar3;
        puVar3->prev = puVar8->prev;
        puVar8->next = puVar8;
        puVar8->prev = puVar8;
        uVar2 = *(uint *)&puVar8[-2].prev;
        if (((uVar2 & 4) != 0) && (*(uint *)&puVar8[-2].prev = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)
           ) {
          ppuVar1 = &(puVar8[-5].prev)->prev;
          *(int *)ppuVar1 = *(int *)ppuVar1 + -1;
        }
        if (puVar8[-1].next != (uv__queue *)0x0) {
          uVar7 = *(uint *)&puVar8[1].next & 0x7f;
          uVar2 = *(uint *)&puVar8[1].next >> 8 & 0xff;
          if (uVar7 != 0) {
            uVar2 = 0;
          }
          if ((int)(uVar7 * 0x1000000 + 0x1000000) < 0x2000000) {
            uVar7 = 0;
          }
          (*(code *)puVar8[-1].next)(puVar8 + -5,uVar2,uVar7);
        }
        puVar8 = puVar3;
      } while (puVar3 != &local_38);
      if (local_38.next != &local_38) {
        __assert_fail("uv__queue_empty(&pending)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                      ,0xbe,"void uv__wait_children(uv_loop_t *)");
      }
    }
  }
  return;
}

Assistant:

void uv__wait_children(uv_loop_t* loop) {
  uv_process_t* process;
  int exit_status;
  int term_signal;
  int status;
  int options;
  pid_t pid;
  struct uv__queue pending;
  struct uv__queue* q;
  struct uv__queue* h;

  uv__queue_init(&pending);

  h = &loop->process_handles;
  q = uv__queue_head(h);
  while (q != h) {
    process = uv__queue_data(q, uv_process_t, queue);
    q = uv__queue_next(q);

#ifndef UV_USE_SIGCHLD
    if ((process->flags & UV_HANDLE_REAP) == 0)
      continue;
    options = 0;
    process->flags &= ~UV_HANDLE_REAP;
    loop->nfds--;
#else
    options = WNOHANG;
#endif

    do
      pid = waitpid(process->pid, &status, options);
    while (pid == -1 && errno == EINTR);

#ifdef UV_USE_SIGCHLD
    if (pid == 0) /* Not yet exited */
      continue;
#endif

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      /* The child died, and we missed it. This probably means someone else
       * stole the waitpid from us. Handle this by not handling it at all. */
      continue;
    }

    assert(pid == process->pid);
    process->pid = 0; // pid is no longer valid (or unique)
    process->status = status;
    uv__queue_remove(&process->queue);
    uv__queue_insert_tail(&pending, &process->queue);
  }

  h = &pending;
  q = uv__queue_head(h);
  while (q != h) {
    process = uv__queue_data(q, uv_process_t, queue);
    q = uv__queue_next(q);

    uv__queue_remove(&process->queue);
    uv__queue_init(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(uv__queue_empty(&pending));
}